

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O0

void (anonymous_namespace)::run_tests<false,6>(void)

{
  test_empty_vector<false,6>();
  test_push_back_simple<false,6>();
  test_push_back<false,6>(40000);
  test_front<false,6>(40000);
  test_back<false,6>(40000);
  test_size<false,6>(40000);
  test_pop_back<false,6>(40000);
  test_update<false,6>(400000,0x208d9);
  test_erase_single<false,6>(10000);
  test_erase<false,6>(200,0x32);
  test_insert_single<false,6>(10000);
  test_concat<false,6>(200);
  test_drop<false,6>(10000);
  test_take<false,6>(10000);
  test_iterator<false,6>(10000);
  test_iterator_2<false,6>(1000);
  test_iterator_3<false,6>(10000);
  test_reverse_iterator<false,6>(10000);
  test_vector_equality<false,6>();
  test_insert_vector<false,6>(10);
  test_transient_vector_push<false,6>(13000);
  test_transient_vector_pop<false,6>(400000);
  test_transient_vector_update<false,6>(400000,0x208d9);
  test_transient_vector_push_2<false,6>(400,0x28,0x32);
  test_transient_iterator<false,6>(10000);
  test_transient_iterator_2<false,6>(1000);
  test_transient_iterator_3<false,6>(10000);
  test_transient_reverse_iterator<false,6>(10000);
  test_catslice<false,6>(400,0x35,0x906,10);
  test_fibocat<false,6>(0xa28,200);
  test_invalid_states<false,6>();
  test_erase<false,6>(10000,0x9c4);
  test_concat<false,6>(2000);
  test_vector_of_vector<false,6>();
  test_vector_bug_1<false,6>();
  test_bug_concat<false,6>();
  return;
}

Assistant:

void run_tests()
    {        
    test_empty_vector<atomic_ref_counting, N>();
    test_push_back_simple<atomic_ref_counting, N>();
    test_push_back<atomic_ref_counting, N>();
    test_front<atomic_ref_counting, N>();
    test_back<atomic_ref_counting, N>();
    test_size<atomic_ref_counting, N>();
    test_pop_back<atomic_ref_counting, N>();
    test_update<atomic_ref_counting, N>();
    test_erase_single<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>(200, 50);
    test_insert_single<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>(200);
    test_drop<atomic_ref_counting, N>();
    test_take<atomic_ref_counting, N>();
    test_iterator<atomic_ref_counting, N>();
    test_iterator_2<atomic_ref_counting, N>();
    test_iterator_3<atomic_ref_counting, N>();
    test_reverse_iterator<atomic_ref_counting, N>();
    test_vector_equality<atomic_ref_counting, N>();
    test_insert_vector<atomic_ref_counting, N>();
    test_transient_vector_push<atomic_ref_counting, N>();
    test_transient_vector_pop<atomic_ref_counting, N>();
    test_transient_vector_update<atomic_ref_counting, N>();
    test_transient_vector_push_2<atomic_ref_counting, N>();
    test_transient_iterator<atomic_ref_counting, N>();
    test_transient_iterator_2<atomic_ref_counting, N>();
    test_transient_iterator_3<atomic_ref_counting, N>();
    test_transient_reverse_iterator<atomic_ref_counting, N>();
    test_catslice<atomic_ref_counting, N>();
    test_fibocat<atomic_ref_counting, N>();
    test_invalid_states<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>();    
    test_vector_of_vector<atomic_ref_counting, N>();
    test_vector_bug_1<atomic_ref_counting, N>();
    test_bug_concat<atomic_ref_counting, N>();
    }